

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O3

int __thiscall
glcts::SampleShadingApiCaseGroup::init(SampleShadingApiCaseGroup *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *node;
  
  node = (TestNode *)operator_new(0x88);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)node,pCVar2->m_testCtx,"verify",fixed_sample_locations_values + 1);
  node[1]._vptr_TestNode = (_func_int **)pCVar2;
  node->_vptr_TestNode = (_func_int **)&PTR__SampleShadingApiCase_020f2d48;
  *(GLSLVersion *)&node[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,node);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		addChild(new SampleShadingApiCase(m_context, m_glslVersion));
	}